

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_optional.pb.cc
# Opt level: O0

void proto2_unittest::TestProto3OptionalMessage_NestedMessage::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestProto3OptionalMessage_NestedMessage *pTVar2;
  MessageLite *value;
  string *value_00;
  bool bVar3;
  TestProto3OptionalMessage_NestedMessage **v1;
  TestProto3OptionalMessage_NestedMessage **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  uint32_t *puVar5;
  ulong uVar6;
  Arena *pAVar7;
  allocator<char> local_b1;
  MessageLite local_b0 [2];
  uint local_90;
  uint32_t cached_has_bits;
  LogMessage local_80;
  Voidify local_69;
  TestProto3OptionalMessage_NestedMessage *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestProto3OptionalMessage_NestedMessage *from;
  TestProto3OptionalMessage_NestedMessage *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  TestProto3OptionalMessage_NestedMessage *local_30;
  anon_union_16_1_493b367e_for_TestProto3OptionalMessage_NestedMessage_3 *local_28;
  string *local_20;
  TestProto3OptionalMessage_NestedMessage *local_18;
  anon_union_16_1_493b367e_for_TestProto3OptionalMessage_NestedMessage_3 *local_10;
  
  local_68 = (TestProto3OptionalMessage_NestedMessage *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestProto3OptionalMessage_NestedMessage *)to_msg;
  _this = (TestProto3OptionalMessage_NestedMessage *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestProto3OptionalMessage_NestedMessage_const*>
                 (&local_68);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestProto3OptionalMessage_NestedMessage*>(&from);
  local_60 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestProto3OptionalMessage_NestedMessage_const*,proto2_unittest::TestProto3OptionalMessage_NestedMessage*>
                       (v1,v2,"&from != _this");
  if (local_60 == (Nullable<const_char_*>)0x0) {
    local_90 = 0;
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    local_90 = *puVar5;
    if ((local_90 & 1) != 0) {
      _internal_s_abi_cxx11_
                ((TestProto3OptionalMessage_NestedMessage *)absl_log_internal_check_op_result);
      uVar6 = std::__cxx11::string::empty();
      pTVar2 = from;
      if ((uVar6 & 1) == 0) {
        local_20 = _internal_s_abi_cxx11_
                             ((TestProto3OptionalMessage_NestedMessage *)
                              absl_log_internal_check_op_result);
        local_18 = pTVar2;
        local_10 = &pTVar2->field_0;
        puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                           (&(pTVar2->field_0)._impl_._has_bits_,0);
        value_00 = local_20;
        *puVar5 = *puVar5 | 1;
        pAVar7 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(pTVar2->field_0)._impl_.s_,value_00,pAVar7);
      }
      else {
        bVar3 = google::protobuf::internal::ArenaStringPtr::IsDefault(&(from->field_0)._impl_.s_);
        pTVar2 = from;
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_b0,anon_var_dwarf_37cdd0 + 5,&local_b1);
          local_30 = pTVar2;
          to_msg_local = local_b0;
          local_28 = &pTVar2->field_0;
          puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                             (&(local_28->_impl_)._has_bits_,0);
          value = to_msg_local;
          *(byte *)puVar5 = (byte)*puVar5 | 1;
          pAVar7 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
          google::protobuf::internal::ArenaStringPtr::Set<>
                    (&(pTVar2->field_0)._impl_.s_,(string *)value,pAVar7);
          std::__cxx11::string::~string((string *)local_b0);
          std::allocator<char>::~allocator(&local_b1);
        }
      }
    }
    uVar1 = local_90;
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar5 = uVar1 | *puVar5;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_optional.pb.cc"
             ,0x612,failure_msg);
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
}

Assistant:

void TestProto3OptionalMessage_NestedMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestProto3OptionalMessage_NestedMessage*>(&to_msg);
  auto& from = static_cast<const TestProto3OptionalMessage_NestedMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestProto3OptionalMessage.NestedMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    if (!from._internal_s().empty()) {
      _this->_internal_set_s(from._internal_s());
    } else {
      if (_this->_impl_.s_.IsDefault()) {
        _this->_internal_set_s("");
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}